

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

MultiFab * __thiscall NavierStokesBase::getDsdt(NavierStokesBase *this,int ngrow,Real time)

{
  FabFactory<amrex::FArrayBox> *val;
  undefined4 in_ESI;
  DistributionMapping *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  int in_stack_00000008;
  int in_stack_0000000c;
  NavierStokesBase *in_stack_00000010;
  MultiFab *dsdt;
  AmrLevel *this_00;
  undefined4 in_stack_ffffffffffffff90;
  undefined8 *puVar1;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffac;
  MultiFab *in_stack_ffffffffffffffb0;
  undefined8 local_48;
  FabFactory<amrex::FArrayBox> *factory;
  AmrLevel *local_20;
  
  if ((have_dsdt == 0) || (have_divu == 0)) {
    local_20 = (AmrLevel *)operator_new(0x180);
    uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffa8);
    local_48 = 0;
    factory = (FabFactory<amrex::FArrayBox> *)0x0;
    puVar1 = &local_48;
    amrex::MFInfo::MFInfo((MFInfo *)0x7bba76);
    val = amrex::AmrLevel::Factory(local_20);
    amrex::MultiFab::MultiFab
              (in_stack_ffffffffffffffb0,(BoxArray *)CONCAT44(in_stack_ffffffffffffffac,uVar2),
               in_RDI,(int)((ulong)puVar1 >> 0x20),(int)puVar1,
               (MFInfo *)CONCAT44(in_ESI,in_stack_ffffffffffffff90),factory);
    this_00 = local_20;
    amrex::MFInfo::~MFInfo((MFInfo *)0x7bbac7);
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)this_00,(value_type)val);
  }
  else {
    local_20 = (AmrLevel *)
               getState(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr_00,
                        unaff_retaddr,(Real)in_RDI);
  }
  return (MultiFab *)local_20;
}

Assistant:

MultiFab*
NavierStokesBase::getDsdt (int ngrow, Real time)
{
    MultiFab* dsdt = nullptr;

    if (!(have_dsdt && have_divu))
    {
        dsdt = new MultiFab(grids,dmap,1,ngrow,MFInfo(),Factory());

        dsdt->setVal(0);
    }
    else
    {
        dsdt = getState(ngrow,Dsdt_Type,0,1,time);
    }

    return dsdt;
}